

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O0

void __thiscall
Annotator_automaticIdsNoModel_Test::~Annotator_automaticIdsNoModel_Test
          (Annotator_automaticIdsNoModel_Test *this)

{
  Annotator_automaticIdsNoModel_Test *this_local;
  
  ~Annotator_automaticIdsNoModel_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Annotator, automaticIdsNoModel)
{
    const std::string e = "This Annotator object does not have a model to work with.";
    auto annotator = libcellml::Annotator::create();

    EXPECT_FALSE(annotator->assignIds(libcellml::CellmlElementType::MODEL));
    EXPECT_FALSE(annotator->hasModel());

    EXPECT_EQ(size_t(1), annotator->errorCount());
    EXPECT_EQ(e, annotator->error(0)->description());
}